

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O1

int coda_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  coda_native_type cVar1;
  uint uVar2;
  coda_backend cVar3;
  int *piVar4;
  coda_product *product;
  coda_product_struct *pcVar5;
  coda_dynamic_type_struct *pcVar6;
  anon_struct_24_3_5e6533e2 *paVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  size_t __n;
  long lVar11;
  int64_t length;
  char *pcVar12;
  coda_cursor *cursor_00;
  long lVar13;
  coda_type *pcVar14;
  long *plVar15;
  long lVar16;
  bool bVar17;
  uint8_t uStack_3b1;
  coda_cursor *pcStack_3b0;
  long *plStack_3a8;
  long lStack_3a0;
  long *plStack_398;
  anon_struct_24_3_5e6533e2 *paStack_390;
  char acStack_388 [64];
  coda_cursor cStack_348;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar6 = cursor->stack[cursor->n - 1].type, pcVar6 == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x659);
    return -1;
  }
  cVar3 = pcVar6->backend;
  if (100 < (int)cVar3) {
    if (cVar3 - coda_backend_hdf4 < 5) {
      *bit_size = -1;
    }
    return 0;
  }
  if (cVar3 != coda_backend_ascii) {
    if (cVar3 != coda_backend_binary) {
      if (cVar3 == coda_backend_memory) {
        iVar8 = coda_mem_cursor_get_bit_size(cursor,bit_size);
        return iVar8;
      }
      return 0;
    }
    pcVar14 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
    if (99 < pcVar14->format) {
      pcVar14 = *(coda_type **)&pcVar14->type_class;
    }
    if (pcVar14->bit_size < 0) {
      uVar2 = pcVar14->type_class;
      if (uVar2 - 2 < 4) {
        if (pcVar14->size_expr != (coda_expression *)0x0) {
          cStack_348.stack[0].index = 0x11d840;
          iVar8 = coda_expression_eval_integer(pcVar14->size_expr,cursor,bit_size);
          if (iVar8 == 0) {
            if (pcVar14->bit_size == -8) {
              *bit_size = *bit_size << 3;
            }
            if (-1 < *bit_size) {
              return 0;
            }
            cStack_348.stack[0].index = 0x11d8dc;
            coda_set_error(-300,"calculated size is negative (%ld bits)");
          }
          else {
            cStack_348.stack[0].index = 0x11d852;
            coda_add_error_message(" for size expression");
          }
          cStack_348.stack[0].index = 0x11d85a;
          coda_cursor_add_to_error_message(cursor);
          return -1;
        }
        *bit_size = -1;
      }
      else {
        if (uVar2 < 2) {
          iVar8 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
          return iVar8;
        }
        if (uVar2 == 6) {
          cStack_348.stack[0].index = 0x11d890;
          memcpy(&cStack_348.stack[0].bit_offset,cursor,0x310);
          cStack_348.stack[0].index = 0x11d898;
          iVar8 = coda_ascbin_cursor_use_base_type_of_special_type
                            ((coda_cursor *)&cStack_348.stack[0].bit_offset);
          if (iVar8 != 0) {
            return -1;
          }
          cStack_348.stack[0].index = 0x11d8ec;
          iVar8 = coda_cursor_get_bit_size((coda_cursor *)&cStack_348.stack[0].bit_offset,bit_size);
          if (iVar8 != 0) {
            return -1;
          }
        }
      }
    }
    else {
      *bit_size = pcVar14->bit_size;
    }
    return 0;
  }
  pcVar14 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar14->format) {
    pcVar14 = *(coda_type **)&pcVar14->type_class;
  }
  lVar10 = pcVar14->bit_size;
  if (-1 < lVar10) goto LAB_0011ab18;
  if (pcVar14->type_class < 2) {
    iVar8 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
    return iVar8;
  }
  lVar10 = cursor->stack[(long)cursor->n + -1].bit_offset;
  iVar8 = get_bit_size_boundary(cursor,&lStack_3a0,-1);
  if (iVar8 != 0) {
    return -1;
  }
  iVar8 = pcVar14->type_class;
  pcStack_3b0 = cursor;
  if (iVar8 - 2U < 2) {
    plVar15 = (long *)pcVar14[1].description;
    bVar17 = true;
    if (plVar15 == (long *)0x0) {
      bVar17 = pcVar14->size_expr == (coda_expression *)0x0;
    }
  }
  else if (iVar8 == 4) {
    bVar17 = pcVar14->size_expr == (coda_expression *)0x0;
    if (!bVar17) goto LAB_0011abe7;
    plVar15 = (long *)0x0;
    if (pcVar14[1].type_class == coda_record_class) goto LAB_0011ad5b;
  }
  else if ((iVar8 == 6) && (pcVar14[1].format == 2)) {
    if (*(int *)(*(long *)&pcVar14[1].type_class + 8) != 4) {
      __assert_fail("base_type->type_class == coda_text_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x2be,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    plVar15 = (long *)0x0;
    if (*(int *)(*(long *)&pcVar14[1].type_class + 0x40) == 0) {
LAB_0011ad5b:
      *bit_size = lStack_3a0;
      return 0;
    }
    bVar17 = false;
  }
  else {
    bVar17 = false;
LAB_0011abe7:
    plVar15 = (long *)0x0;
  }
  length = -1;
  paStack_390 = cursor->stack;
  if (bVar17) {
    length = 0x40;
    if (lStack_3a0 >> 3 < 0x40) {
      length = lStack_3a0 >> 3;
    }
    iVar8 = read_bytes_in_bounds(cursor->product,lVar10 >> 3,length,acStack_388);
    if (iVar8 != 0) {
      return -1;
    }
  }
  if (plVar15 != (long *)0x0) {
    lVar10 = plVar15[1];
    plStack_3a8 = bit_size;
    plStack_398 = plVar15;
    if (0 < (long)(int)lVar10) {
      lVar11 = plVar15[2];
      lVar16 = 0;
      do {
        piVar4 = *(int **)(lVar11 + lVar16 * 8);
        iVar8 = *piVar4;
        __n = (size_t)iVar8;
        if (__n == 0) {
          if (length == 0) {
            *plStack_3a8 = 0;
            return 0;
          }
        }
        else if (((long)__n <= length) &&
                (iVar9 = bcmp(*(void **)(piVar4 + 2),acStack_388,__n), iVar9 == 0)) {
          *plStack_3a8 = (long)(iVar8 << 3);
          return 0;
        }
        lVar16 = lVar16 + 1;
      } while ((int)lVar10 != lVar16);
    }
    lVar10 = *plStack_398;
    bit_size = plStack_3a8;
    if (-1 < lVar10) goto LAB_0011acbe;
  }
  paVar7 = paStack_390;
  cursor_00 = pcStack_3b0;
  iVar8 = pcVar14->type_class;
  if (iVar8 == 6) {
    memcpy(&cStack_348,pcStack_3b0,0x310);
    iVar8 = coda_cursor_use_base_type_of_special_type(&cStack_348);
    if (iVar8 == 0) {
      iVar8 = coda_cursor_get_bit_size(&cStack_348,bit_size);
      return iVar8;
    }
    return -1;
  }
  if (pcVar14->size_expr != (coda_expression *)0x0) {
    iVar8 = coda_expression_eval_integer(pcVar14->size_expr,pcStack_3b0,bit_size);
    if (iVar8 == 0) {
      if (pcVar14->bit_size == -8) {
        *bit_size = *bit_size << 3;
      }
      if (-1 < *bit_size) {
        return 0;
      }
      coda_set_error(-300,"calculated size is negative (%ld bits)");
      cursor_00 = pcStack_3b0;
    }
    else {
      coda_add_error_message(" for size expression");
    }
    coda_cursor_add_to_error_message(cursor_00);
    return -1;
  }
  if (iVar8 - 2U < 2) {
    cVar1 = pcVar14->read_type;
    if (9 < (uint)cVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x329,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    if ((0x55U >> (cVar1 & 0x1f) & 1) == 0) {
      if ((0xaaU >> (cVar1 & 0x1f) & 1) == 0) {
        lVar10 = coda_ascii_parse_double(acStack_388,length,(double *)&cStack_348,1);
      }
      else {
        lVar10 = coda_ascii_parse_uint64(acStack_388,length,(uint64_t *)&cStack_348,1);
      }
    }
    else {
      lVar10 = coda_ascii_parse_int64(acStack_388,length,(int64_t *)&cStack_348,1);
    }
    if (lVar10 < 0) {
      return -1;
    }
    lVar10 = lVar10 << 3;
    plStack_3a8 = bit_size;
LAB_0011acbe:
    *plStack_3a8 = lVar10;
    return 0;
  }
  if (iVar8 != 4) {
    __assert_fail("type->type_class == coda_text_class",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                  ,0x335,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
  }
  switch(pcVar14[1].type_class) {
  case coda_record_class:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                  ,0x40f,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
  case coda_array_class:
    if (pcStack_3b0->product->format != coda_format_ascii) {
      __assert_fail("cursor->product->format == coda_format_ascii",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x339,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    iVar8 = (int)pcStack_3b0->product[1].file_size;
    lVar10 = 8;
    if (iVar8 - 1U < 2) {
LAB_0011ab18:
      *bit_size = lVar10;
      return 0;
    }
    if (iVar8 != 0) {
      if (iVar8 != 3) {
        return 0;
      }
      lVar10 = 0x10;
      goto LAB_0011ab18;
    }
    if ((paStack_390[(long)pcStack_3b0->n + -1].bit_offset & 7) != 0) {
      bVar17 = false;
      coda_set_error(-300,
                     "product error detected (ascii line separator does not start at byte boundary)"
                    );
      iVar8 = -1;
      goto joined_r0x0011af54;
    }
    bVar17 = false;
    iVar9 = coda_ascii_cursor_read_bytes(pcStack_3b0,&uStack_3b1,0,1);
    iVar8 = -1;
    if (iVar9 != 0) goto joined_r0x0011af54;
    if (uStack_3b1 == '\r') {
      if (1 < pcStack_3b0->product->file_size - (paVar7[(long)pcStack_3b0->n + -1].bit_offset >> 3))
      {
        iVar9 = coda_ascii_cursor_read_bytes(pcStack_3b0,&uStack_3b1,1,1);
        if (iVar9 != 0) {
          bVar17 = false;
          goto joined_r0x0011af54;
        }
        if (uStack_3b1 == '\n') {
          *bit_size = 0x10;
          *(undefined4 *)&pcStack_3b0->product[1].file_size = 3;
          goto LAB_0011b29f;
        }
      }
      *bit_size = 8;
      *(undefined4 *)&pcStack_3b0->product[1].file_size = 2;
    }
    else {
      if (uStack_3b1 != '\n') {
        coda_str64(paVar7[(long)pcStack_3b0->n + -1].bit_offset >> 3,(char *)&cStack_348);
        bVar17 = false;
        coda_set_error(-300,
                       "product error detected (invalid end-of-line sequence - not a carriage return or linefeed character - byte offset = %s)"
                       ,&cStack_348);
        goto joined_r0x0011af54;
      }
      *bit_size = 8;
      *(undefined4 *)&pcStack_3b0->product[1].file_size = 1;
    }
LAB_0011b29f:
    iVar8 = 0;
    bVar17 = true;
    goto joined_r0x0011af54;
  case coda_integer_class:
  case coda_real_class:
    product = pcStack_3b0->product;
    if (product->format == coda_format_ascii) {
      if ((paStack_390[(long)pcStack_3b0->n + -1].bit_offset & 7) == 0) {
        if ((product[1].root_type == (coda_dynamic_type *)0x0) &&
           (iVar8 = coda_ascii_init_asciilines(product), iVar8 != 0)) {
          iVar8 = -1;
          bVar17 = false;
          goto joined_r0x0011af54;
        }
        pcVar5 = cursor_00->product;
        if (*(long *)&pcVar5[1].format != 0) {
          lVar11 = paVar7[(long)pcStack_3b0->n + -1].bit_offset >> 3;
          lVar10 = *(long *)&pcVar5[1].format + -1;
          if (lVar10 != 0) {
            lVar13 = 0;
            lVar16 = lVar10;
            do {
              lVar10 = (lVar16 + lVar13) / 2;
              if (*(long *)(&(pcVar5[1].root_type)->backend + lVar10 * 2) <= lVar11) {
                lVar13 = lVar10 + 1;
                lVar10 = lVar16;
              }
              lVar16 = lVar10;
            } while (lVar10 != lVar13);
          }
          lVar11 = (*(long *)(&(pcVar5[1].root_type)->backend + lVar10 * 2) - lVar11) * 8;
          *bit_size = lVar11;
          bVar17 = true;
          if ((pcVar14[1].type_class == coda_real_class) &&
             (((lVar10 != *(long *)&pcVar5[1].format + -1 ||
               (*(int *)&pcVar5[1].product_definition != 0)) &&
              (*bit_size = lVar11 + -8, (int)pcVar5[1].file_size == 3)))) {
            *bit_size = lVar11 + -0x10;
          }
          iVar8 = 0;
          goto joined_r0x0011af54;
        }
        pcVar12 = "trying to read from an empty file";
        iVar8 = -0x12d;
      }
      else {
        pcVar12 = "product error detected (ascii line does not start at byte boundary)";
        iVar8 = -300;
      }
      bVar17 = false;
      coda_set_error(iVar8,pcVar12);
      iVar8 = -1;
      goto joined_r0x0011af54;
    }
    if ((paStack_390[(long)pcStack_3b0->n + -1].bit_offset & 7U) == 0) {
      lVar11 = paStack_390[(long)pcStack_3b0->n + -1].bit_offset >> 3;
      lVar10 = 0;
      lVar16 = product->file_size - lVar11;
      if (lVar11 < product->file_size) {
        do {
          iVar8 = read_bytes_in_bounds(pcStack_3b0->product,lVar10 + lVar11,1,&cStack_348);
          if (iVar8 != 0) goto LAB_0011aff2;
        } while ((((char)cStack_348.product != '\n') && ((char)cStack_348.product != '\r')) &&
                (lVar10 = lVar10 + 1, lVar16 != lVar10));
      }
      if (pcVar14[1].type_class == coda_integer_class) {
        if (((char)cStack_348.product == '\r') && (lVar10 + 1 < lVar16)) {
          iVar8 = read_bytes_in_bounds(pcStack_3b0->product,lVar10 + lVar11 + 1,1,&cStack_348);
          if (iVar8 != 0) {
LAB_0011aff2:
            iVar8 = -1;
            bVar17 = false;
            goto joined_r0x0011af54;
          }
          if ((char)cStack_348.product == '\n') {
            lVar10 = lVar10 + 1;
          }
        }
        lVar10 = lVar10 + 1;
      }
      *bit_size = lVar10 << 3;
      iVar8 = 0;
      bVar17 = true;
      goto joined_r0x0011af54;
    }
    pcVar12 = "product error detected (ascii line does not start at byte boundary)";
    break;
  case coda_text_class:
    if ((paStack_390[(long)pcStack_3b0->n + -1].bit_offset & 7U) == 0) {
      lVar16 = paStack_390[(long)pcStack_3b0->n + -1].bit_offset >> 3;
      lVar10 = pcStack_3b0->product->file_size;
      lVar11 = 0;
      if (lVar16 < lVar10) {
        do {
          iVar8 = read_bytes_in_bounds(pcStack_3b0->product,lVar16 + lVar11,1,&cStack_348);
          if (iVar8 != 0) goto LAB_0011aff2;
        } while ((((char)cStack_348.product == ' ') || ((char)cStack_348.product == '\t')) &&
                (lVar11 = lVar11 + 1, lVar10 - lVar16 != lVar11));
        lVar11 = lVar11 << 3;
      }
      *bit_size = lVar11;
      bVar17 = true;
      iVar8 = 0;
      goto joined_r0x0011af54;
    }
    pcVar12 = "product error detected (ascii white space does not start at byte boundary)";
    break;
  default:
    return 0;
  }
  bVar17 = false;
  coda_set_error(-300,pcVar12);
  iVar8 = -1;
joined_r0x0011af54:
  if (bVar17) {
    return 0;
  }
  return iVar8;
}

Assistant:

LIBCODA_API int coda_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_binary:
            return coda_bin_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_memory:
            return coda_mem_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            *bit_size = -1;
            break;
    }

    return 0;
}